

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderMoreACsInGSThanSupportedTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMoreACsInGSThanSupportedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *local_1e8;
  char *gs_code_raw;
  string gs_code;
  GLint n_ac_1;
  GLint n_ac;
  GLint gl_max_ACs_value;
  long local_1a8;
  Functions *gl;
  stringstream code_sstream;
  ostream local_190;
  GeometryShaderMoreACsInGSThanSupportedTest *local_18;
  GeometryShaderMoreACsInGSThanSupportedTest *this_local;
  string *gs_code_specialized;
  
  local_18 = this;
  this_local = (GeometryShaderMoreACsInGSThanSupportedTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&gl);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_1a8 = CONCAT44(extraout_var,iVar1);
  n_ac_1 = 0;
  (**(code **)(local_1a8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,&n_ac_1);
  err = (**(code **)(local_1a8 + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x671);
  std::operator<<(&local_190,
                  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\n"
                 );
  for (gs_code.field_2._12_4_ = 0; (int)gs_code.field_2._12_4_ < n_ac_1 + 1;
      gs_code.field_2._12_4_ = gs_code.field_2._12_4_ + 1) {
    poVar3 = std::operator<<(&local_190,"layout(binding = 0) uniform atomic_uint counter");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,gs_code.field_2._12_4_);
    std::operator<<(poVar3,";\n");
  }
  std::operator<<(&local_190,"\nvoid main()\n{\n");
  for (gs_code.field_2._8_4_ = 0; (int)gs_code.field_2._8_4_ < n_ac_1 + 1;
      gs_code.field_2._8_4_ = gs_code.field_2._8_4_ + 1) {
    poVar3 = std::operator<<(&local_190,"    if ((gl_PrimitiveIDIn % ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,gs_code.field_2._8_4_ + 1);
    poVar3 = std::operator<<(poVar3,") == 0) atomicCounterIncrement(counter");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,gs_code.field_2._8_4_);
    std::operator<<(poVar3,");\n");
  }
  std::operator<<(&local_190,"\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringstream::str();
  local_1e8 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_1e8);
  std::__cxx11::string::~string((string *)&gs_code_raw);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gl);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMoreACsInGSThanSupportedTest::getGSCode()
{
	std::stringstream	 code_sstream;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_ACs_value = 0;

	/* Retrieve GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &gl_max_ACs_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT pname");

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n";

	for (glw::GLint n_ac = 0; n_ac < (gl_max_ACs_value + 1); ++n_ac)
	{
		code_sstream << "layout(binding = 0) uniform atomic_uint counter" << n_ac << ";\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_ac = 0; n_ac < (gl_max_ACs_value + 1); ++n_ac)
	{
		code_sstream << "    if ((gl_PrimitiveIDIn % " << (n_ac + 1) << ") == 0) atomicCounterIncrement(counter" << n_ac
					 << ");\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1, /* parts */
													   &gs_code_raw);

	return gs_code_specialized;
}